

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

bool __thiscall CDirectiveSkip::Validate(CDirectiveSkip *this,ValidateState *state)

{
  bool bVar1;
  int64_t iVar2;
  Architecture *pAVar3;
  
  iVar2 = FileManager::getVirtualAddress(g_fileManager);
  this->virtualAddress = iVar2;
  if (((this->expression).expression.
       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) &&
     (bVar1 = Expression::evaluateInteger<long>(&this->expression,&this->value), !bVar1)) {
    Logger::queueError<>(FatalError,"Invalid skip length");
    return false;
  }
  pAVar3 = Architecture::current();
  (*pAVar3->_vptr_Architecture[3])(pAVar3);
  FileManager::advanceMemory(g_fileManager,this->value);
  return false;
}

Assistant:

bool CDirectiveSkip::Validate(const ValidateState &state)
{
	virtualAddress = g_fileManager->getVirtualAddress();

	if (expression.isLoaded())
	{
		if (!expression.evaluateInteger(value))
		{
			Logger::queueError(Logger::FatalError, "Invalid skip length");
			return false;
		}
	}

	Architecture::current().NextSection();
	g_fileManager->advanceMemory(value);

	return false;
}